

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::TextureFilterMinmaxParameterQueriesTestCase::iterate
          (TextureFilterMinmaxParameterQueriesTestCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  pointer pRVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  testReductionModeQueriesDefaultValues(this,(Functions *)CONCAT44(extraout_var,iVar1));
  for (pRVar2 = (this->m_utils).m_reductionModeParams.
                super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar2 != (this->m_utils).m_reductionModeParams.
                super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                ._M_impl.super__Vector_impl_data._M_finish; pRVar2 = pRVar2 + 1) {
    testReductionModeQueries(this,(Functions *)CONCAT44(extraout_var,iVar1),pRVar2->m_reductionMode)
    ;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureFilterMinmaxParameterQueriesTestCase::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	testReductionModeQueriesDefaultValues(gl);

	for (TextureFilterMinmaxUtils::ReductionModeParamIter iter = m_utils.getReductionModeParams().begin();
		 iter != m_utils.getReductionModeParams().end(); ++iter)
	{
		testReductionModeQueries(gl, iter->m_reductionMode);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}